

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrFrameEndInfo *value,string *prefix,
               string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  XrCompositionLayerBaseHeader *value_01;
  bool bVar2;
  XrInstance pXVar3;
  ostream *poVar4;
  invalid_argument *piVar5;
  ulong uVar6;
  XrFrameEndInfo *in_stack_fffffffffffff9e8;
  string layers_prefix;
  string type_prefix;
  string layercount_prefix;
  string environmentblendmode_prefix;
  string displaytime_prefix;
  string next_prefix;
  string local_538;
  ostringstream oss_layerCount;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string layers_array_prefix;
  ostringstream oss_layers_array;
  uint auStack_308 [88];
  ostringstream oss_layers;
  uint auStack_190 [88];
  
  PointerToHexString<XrFrameEndInfo>(in_stack_fffffffffffff9e8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_layerCount);
  std::__cxx11::string::~string((string *)&oss_layerCount);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_layerCount,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_layerCount)
    ;
    std::__cxx11::string::~string((string *)&oss_layerCount);
  }
  else {
    _oss_layerCount = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_layerCount);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_layerCount);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_538,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_538,contents);
  std::__cxx11::string::~string((string *)&local_538);
  if (bVar2) {
    std::__cxx11::string::string((string *)&displaytime_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&displaytime_prefix);
    std::__cxx11::to_string((string *)&oss_layerCount,value->displayTime);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])"XrTime",&displaytime_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_layerCount)
    ;
    std::__cxx11::string::~string((string *)&oss_layerCount);
    std::__cxx11::string::string((string *)&environmentblendmode_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&environmentblendmode_prefix);
    std::__cxx11::to_string((string *)&oss_layerCount,value->environmentBlendMode);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[23],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [23])"XrEnvironmentBlendMode",&environmentblendmode_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_layerCount)
    ;
    std::__cxx11::string::~string((string *)&oss_layerCount);
    std::__cxx11::string::string((string *)&layercount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&layercount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_layerCount);
    poVar4 = std::operator<<((ostream *)&oss_layerCount,"0x");
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&layercount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_layers_array);
    std::__cxx11::string::~string((string *)&oss_layers_array);
    std::__cxx11::string::string((string *)&layers_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&layers_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_layers_array);
    *(uint *)((long)auStack_308 + *(long *)(_oss_layers_array + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_layers_array + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_layers_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[43],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [43])"const XrCompositionLayerBaseHeader* const*",
               &layers_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_layers);
    std::__cxx11::string::~string((string *)&oss_layers);
    uVar6 = 0;
    do {
      if (value->layerCount <= uVar6) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_layers_array);
        std::__cxx11::string::~string((string *)&layers_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_layerCount);
        std::__cxx11::string::~string((string *)&layercount_prefix);
        std::__cxx11::string::~string((string *)&environmentblendmode_prefix);
        std::__cxx11::string::~string((string *)&displaytime_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string((string *)&layers_array_prefix,(string *)&layers_prefix);
      std::__cxx11::string::append((char *)&layers_array_prefix);
      std::__cxx11::to_string((string *)&oss_layers,(uint)uVar6);
      std::__cxx11::string::append((string *)&layers_array_prefix);
      std::__cxx11::string::~string((string *)&oss_layers);
      std::__cxx11::string::append((char *)&layers_array_prefix);
      value_01 = value->layers[uVar6];
      if (value_01 == (XrCompositionLayerBaseHeader *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_layers);
        *(uint *)((long)auStack_190 + *(long *)(_oss_layers + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(_oss_layers + -0x18)) & 0xffffffb5 | 8;
        std::ostream::_M_insert<void_const*>((string *)&oss_layers);
        std::__cxx11::stringbuf::str();
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[43],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [43])"const XrCompositionLayerBaseHeader* const*",
                   &layers_array_prefix,&local_360);
        std::__cxx11::string::~string((string *)&local_360);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_layers);
      }
      else {
        std::__cxx11::string::string((string *)&local_380,(string *)&layers_array_prefix);
        std::__cxx11::string::string
                  ((string *)&local_3a0,"const XrCompositionLayerBaseHeader* const*",
                   (allocator *)&oss_layers);
        bVar2 = ApiDumpOutputXrStruct
                          (gen_dispatch_table,value_01,&local_380,&local_3a0,true,contents);
        std::__cxx11::string::~string((string *)&local_3a0);
        std::__cxx11::string::~string((string *)&local_380);
        if (!bVar2) {
          piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
          __cxa_throw(piVar5,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      std::__cxx11::string::~string((string *)&layers_array_prefix);
      uVar6 = uVar6 + 1;
    } while( true );
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar5,"Invalid Operation");
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrFrameEndInfo* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string displaytime_prefix = prefix;
        displaytime_prefix += "displayTime";
        contents.emplace_back("XrTime", displaytime_prefix, std::to_string(value->displayTime));
        std::string environmentblendmode_prefix = prefix;
        environmentblendmode_prefix += "environmentBlendMode";
        contents.emplace_back("XrEnvironmentBlendMode", environmentblendmode_prefix, std::to_string(value->environmentBlendMode));
        std::string layercount_prefix = prefix;
        layercount_prefix += "layerCount";
        std::ostringstream oss_layerCount;
        oss_layerCount << "0x" << std::hex << (value->layerCount);
        contents.emplace_back("uint32_t", layercount_prefix, oss_layerCount.str());
        std::string layers_prefix = prefix;
        layers_prefix += "layers";
        std::ostringstream oss_layers_array;
        oss_layers_array << std::hex << reinterpret_cast<const void*>(value->layers);
        contents.emplace_back("const XrCompositionLayerBaseHeader* const*", layers_prefix, oss_layers_array.str());
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            std::string layers_array_prefix = layers_prefix;
            layers_array_prefix += "[";
            layers_array_prefix += std::to_string(value_layers_inc);
            layers_array_prefix += "]";
            if (nullptr == value->layers[value_layers_inc]) {
                std::ostringstream oss_layers;
                oss_layers << std::hex << reinterpret_cast<const void*>(value->layers[value_layers_inc]);
                contents.emplace_back("const XrCompositionLayerBaseHeader* const*", layers_array_prefix, oss_layers.str());
            } else if (!ApiDumpOutputXrStruct(gen_dispatch_table, value->layers[value_layers_inc], layers_array_prefix, "const XrCompositionLayerBaseHeader* const*", true, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}